

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CodeDropTable(Parse *pParse,Table *pTab,int iDb,int isView)

{
  u16 *puVar1;
  uint uVar2;
  uint uVar3;
  sqlite3 *db;
  Db *pDVar4;
  Schema *pSVar5;
  char *pcVar6;
  uint uVar7;
  Vdbe *p;
  Trigger *pTrigger;
  Parse *pPVar8;
  Schema **ppSVar9;
  int iVar10;
  Index *pIVar11;
  uint uVar12;
  uint iTable;
  HashElem *pHVar13;
  
  db = pParse->db;
  pDVar4 = db->aDb;
  p = sqlite3GetVdbe(pParse);
  sqlite3BeginWriteOperation(pParse,1,iDb);
  if (pTab->eTabType == '\x01') {
    sqlite3VdbeAddOp3(p,0xaa,0,0,0);
  }
  for (pTrigger = sqlite3TriggerList(pParse,pTab); pTrigger != (Trigger *)0x0;
      pTrigger = pTrigger->pNext) {
    sqlite3DropTriggerPtr(pParse,pTrigger);
  }
  if ((pTab->tabFlags & 8) != 0) {
    sqlite3NestedParse(pParse,"DELETE FROM %Q.sqlite_sequence WHERE name=%Q",pDVar4[iDb].zDbSName,
                       pTab->zName);
  }
  sqlite3NestedParse(pParse,"DELETE FROM %Q.sqlite_master WHERE tbl_name=%Q and type!=\'trigger\'",
                     pDVar4[iDb].zDbSName);
  if ((isView == 0) && (pTab->eTabType != '\x01')) {
    uVar2 = pTab->tnum;
    uVar7 = 0;
    do {
      iTable = uVar2;
      if (uVar7 - 1 < uVar2) {
        iTable = 0;
      }
      for (pIVar11 = pTab->pIndex; pIVar11 != (Index *)0x0; pIVar11 = pIVar11->pNext) {
        uVar3 = pIVar11->tnum;
        uVar12 = iTable;
        if (iTable < uVar3) {
          uVar12 = uVar3;
        }
        if (uVar3 <= uVar7 - 1) {
          iTable = uVar12;
        }
      }
      if (iTable != 0) {
        if (pTab->pSchema == (Schema *)0x0) {
          iVar10 = -0x8000;
        }
        else {
          iVar10 = -1;
          ppSVar9 = &pParse->db->aDb->pSchema;
          do {
            iVar10 = iVar10 + 1;
            pSVar5 = *ppSVar9;
            ppSVar9 = ppSVar9 + 4;
          } while (pSVar5 != pTab->pSchema);
        }
        destroyRootPage(pParse,iTable,iVar10);
        uVar7 = iTable;
      }
    } while (iTable != 0);
  }
  if (pTab->eTabType == '\x01') {
    pcVar6 = pTab->zName;
    iVar10 = sqlite3VdbeAddOp3(p,0xac,iDb,0,0);
    sqlite3VdbeChangeP4(p,iVar10,pcVar6,0);
    pPVar8 = pParse->pToplevel;
    if (pParse->pToplevel == (Parse *)0x0) {
      pPVar8 = pParse;
    }
    pPVar8->mayAbort = '\x01';
  }
  pcVar6 = pTab->zName;
  iVar10 = sqlite3VdbeAddOp3(p,0x97,iDb,0,0);
  sqlite3VdbeChangeP4(p,iVar10,pcVar6,0);
  sqlite3VdbeAddOp3(pParse->pVdbe,100,iDb,1,(pParse->db->aDb[iDb].pSchema)->schema_cookie + 1);
  pSVar5 = db->aDb[iDb].pSchema;
  if ((pSVar5->schemaFlags & 2) != 0) {
    for (pHVar13 = (pSVar5->tblHash).first; pHVar13 != (HashElem *)0x0; pHVar13 = pHVar13->next) {
      if (((Table *)pHVar13->data)->eTabType == '\x02') {
        sqlite3DeleteColumnNames(db,(Table *)pHVar13->data);
      }
    }
    puVar1 = &(db->aDb[iDb].pSchema)->schemaFlags;
    *puVar1 = *puVar1 & 0xfffd;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeDropTable(Parse *pParse, Table *pTab, int iDb, int isView){
  Vdbe *v;
  sqlite3 *db = pParse->db;
  Trigger *pTrigger;
  Db *pDb = &db->aDb[iDb];

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  sqlite3BeginWriteOperation(pParse, 1, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3VdbeAddOp0(v, OP_VBegin);
  }
#endif

  /* Drop all triggers associated with the table being dropped. Code
  ** is generated to remove entries from sqlite_schema and/or
  ** sqlite_temp_schema if required.
  */
  pTrigger = sqlite3TriggerList(pParse, pTab);
  while( pTrigger ){
    assert( pTrigger->pSchema==pTab->pSchema ||
        pTrigger->pSchema==db->aDb[1].pSchema );
    sqlite3DropTriggerPtr(pParse, pTrigger);
    pTrigger = pTrigger->pNext;
  }

#ifndef SQLITE_OMIT_AUTOINCREMENT
  /* Remove any entries of the sqlite_sequence table associated with
  ** the table being dropped. This is done before the table is dropped
  ** at the btree level, in case the sqlite_sequence table needs to
  ** move as a result of the drop (can happen in auto-vacuum mode).
  */
  if( pTab->tabFlags & TF_Autoincrement ){
    sqlite3NestedParse(pParse,
      "DELETE FROM %Q.sqlite_sequence WHERE name=%Q",
      pDb->zDbSName, pTab->zName
    );
  }
#endif

  /* Drop all entries in the schema table that refer to the
  ** table. The program name loops through the schema table and deletes
  ** every row that refers to a table of the same name as the one being
  ** dropped. Triggers are handled separately because a trigger can be
  ** created in the temp database that refers to a table in another
  ** database.
  */
  sqlite3NestedParse(pParse,
      "DELETE FROM %Q." LEGACY_SCHEMA_TABLE
      " WHERE tbl_name=%Q and type!='trigger'",
      pDb->zDbSName, pTab->zName);
  if( !isView && !IsVirtual(pTab) ){
    destroyTable(pParse, pTab);
  }

  /* Remove the table entry from SQLite's internal schema and modify
  ** the schema cookie.
  */
  if( IsVirtual(pTab) ){
    sqlite3VdbeAddOp4(v, OP_VDestroy, iDb, 0, 0, pTab->zName, 0);
    sqlite3MayAbort(pParse);
  }
  sqlite3VdbeAddOp4(v, OP_DropTable, iDb, 0, 0, pTab->zName, 0);
  sqlite3ChangeCookie(pParse, iDb);
  sqliteViewResetAll(db, iDb);
}